

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void mbc2_write_rom(Emulator *e,MaskedAddress addr,u8 value)

{
  u16 local_16;
  u16 rom1_bank;
  u8 value_local;
  MaskedAddress addr_local;
  Emulator *e_local;
  
  if (addr < 0x4000) {
    if ((addr & 0x100) == 0) {
      (e->state).memory_map_state.ext_ram_enabled = (uint)((value & 0xf) == 10);
    }
    else {
      local_16 = value & 0xf & (short)s_rom_bank_count[e->cart_info->rom_size] - 1U;
      if (local_16 == 0) {
        local_16 = 1;
      }
      set_rom_bank(e,1,local_16);
    }
  }
  return;
}

Assistant:

static void mbc2_write_rom(Emulator* e, MaskedAddress addr, u8 value) {
  if (addr < 0x4000) {
    if ((addr & MBC2_ADDR_SELECT_BIT_MASK) != 0) {
      u16 rom1_bank = value & MBC2_ROM_BANK_SELECT_MASK & ROM_BANK_MASK(e);
      if (rom1_bank == 0) {
        rom1_bank++;
      }
      set_rom_bank(e, 1, rom1_bank);
    } else {
      MMAP_STATE.ext_ram_enabled =
          (value & MBC_RAM_ENABLED_MASK) == MBC_RAM_ENABLED_VALUE;
    }
  }
}